

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DTDScanner::getQuotedString(DTDScanner *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh toAppend;
  undefined8 in_RAX;
  XMLCh quoteCh;
  undefined8 uStack_18;
  
  toFill->fIndex = 0;
  uStack_18 = in_RAX;
  bVar1 = ReaderMgr::skipIfQuote(this->fReaderMgr,(XMLCh *)((long)&uStack_18 + 6));
  if (bVar1) {
    while( true ) {
      toAppend = ReaderMgr::getNextChar(this->fReaderMgr);
      bVar1 = toAppend == uStack_18._6_2_;
      if ((toAppend == L'\0') || (toAppend == uStack_18._6_2_)) break;
      XMLBuffer::append(toFill,toAppend);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DTDScanner::getQuotedString(XMLBuffer& toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

	XMLCh nextCh;
    // Get another char and see if it matches the starting quote char
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        //
        //  We should never get either an end of file null char here. If we
        //  do, just fail. It will be handled more gracefully in the higher
        //  level code that called us.
        //
        if (!nextCh)
            return false;

        // Else add it to the buffer
        toFill.append(nextCh);
    }
    return true;
}